

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O3

void Ssc_ManStop(Ssc_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = p->vFront;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vFront->pArray = (int *)0x0;
      pVVar1 = p->vFront;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a332;
    }
    free(pVVar1);
    p->vFront = (Vec_Int_t *)0x0;
  }
LAB_0059a332:
  pVVar1 = p->vFanins;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vFanins->pArray = (int *)0x0;
      pVVar1 = p->vFanins;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a36e;
    }
    free(pVVar1);
    p->vFanins = (Vec_Int_t *)0x0;
  }
LAB_0059a36e:
  pVVar1 = p->vPattern;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vPattern->pArray = (int *)0x0;
      pVVar1 = p->vPattern;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a3aa;
    }
    free(pVVar1);
    p->vPattern = (Vec_Int_t *)0x0;
  }
LAB_0059a3aa:
  pVVar1 = p->vDisPairs;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vDisPairs->pArray = (int *)0x0;
      pVVar1 = p->vDisPairs;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a3e6;
    }
    free(pVVar1);
    p->vDisPairs = (Vec_Int_t *)0x0;
  }
LAB_0059a3e6:
  pVVar1 = p->vPivot;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vPivot->pArray = (int *)0x0;
      pVVar1 = p->vPivot;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a422;
    }
    free(pVVar1);
    p->vPivot = (Vec_Int_t *)0x0;
  }
LAB_0059a422:
  pVVar1 = p->vId2Var;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vId2Var->pArray = (int *)0x0;
      pVVar1 = p->vId2Var;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a45e;
    }
    free(pVVar1);
    p->vId2Var = (Vec_Int_t *)0x0;
  }
LAB_0059a45e:
  pVVar1 = p->vVar2Id;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vVar2Id->pArray = (int *)0x0;
      pVVar1 = p->vVar2Id;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0059a49a;
    }
    free(pVVar1);
    p->vVar2Id = (Vec_Int_t *)0x0;
  }
LAB_0059a49a:
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  Gia_ManStopP(&p->pFraig);
  free(p);
  return;
}

Assistant:

void Ssc_ManStop( Ssc_Man_t * p )
{
    Vec_IntFreeP( &p->vFront );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vPattern );
    Vec_IntFreeP( &p->vDisPairs );
    Vec_IntFreeP( &p->vPivot );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vVar2Id );
    if ( p->pSat ) sat_solver_delete( p->pSat );
    Gia_ManStopP( &p->pFraig );
    ABC_FREE( p );
}